

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AlignmentRecord.cpp
# Opt level: O2

void __thiscall
AlignmentRecord::AlignmentRecord
          (AlignmentRecord *this,BamAlignment *alignment,int readRef,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *rnm,string *mainReference)

{
  AlignmentRecord *phred;
  _Rb_tree_header *p_Var1;
  uint uVar2;
  pointer pCVar3;
  ShortDnaSequence *this_00;
  char cVar4;
  byte bVar5;
  uint uVar6;
  int iVar7;
  size_t sVar8;
  AlignmentRecord *this_01;
  pointer __x;
  uint s;
  int readRef_local;
  vector<AlignmentRecord::mapValue,_std::allocator<AlignmentRecord::mapValue>_> *local_178;
  vector<int,_std::allocator<int>_> *local_170;
  string *local_168;
  string *local_160;
  ShortDnaSequence *local_158;
  set<int,_std::less<int>,_std::allocator<int>_> *local_140;
  ShortDnaSequence *local_138;
  vector<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_> *__range1;
  _Vector_base<char,_std::allocator<char>_> local_128;
  string querySequence;
  string local_f0;
  tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>
  ref1;
  ShortDnaSequence local_78;
  
  (this->name)._M_dataplus._M_p = (pointer)&(this->name).field_2;
  (this->name)._M_string_length = 0;
  (this->name).field_2._M_local_buf[0] = '\0';
  (this->cigar1).super__Vector_base<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->cigar1).super__Vector_base<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->cigar1).super__Vector_base<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->cigar1_unrolled).super__Vector_base<char,_std::allocator<char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->cigar1_unrolled).super__Vector_base<char,_std::allocator<char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->cigar1_unrolled).super__Vector_base<char,_std::allocator<char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  readRef_local = readRef;
  __range1 = &this->cigar1;
  ShortDnaSequence::ShortDnaSequence(&this->sequence1);
  (this->al_sequence1)._M_dataplus._M_p = (pointer)&(this->al_sequence1).field_2;
  (this->al_sequence1)._M_string_length = 0;
  (this->al_sequence1).field_2._M_local_buf[0] = '\0';
  local_138 = &this->sequence2;
  (this->cigar2).super__Vector_base<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->cigar2).super__Vector_base<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->cigar2).super__Vector_base<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->cigar2_unrolled).super__Vector_base<char,_std::allocator<char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->cigar2_unrolled).super__Vector_base<char,_std::allocator<char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->cigar2_unrolled).super__Vector_base<char,_std::allocator<char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_158 = &this->sequence1;
  ShortDnaSequence::ShortDnaSequence(local_138);
  (this->cov_pos).
  super__Vector_base<AlignmentRecord::mapValue,_std::allocator<AlignmentRecord::mapValue>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->cov_pos).
  super__Vector_base<AlignmentRecord::mapValue,_std::allocator<AlignmentRecord::mapValue>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->cov_pos).
  super__Vector_base<AlignmentRecord::mapValue,_std::allocator<AlignmentRecord::mapValue>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  p_Var1 = &(this->readNames)._M_t._M_impl.super__Rb_tree_header;
  (this->readNames)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->readNames)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->readNames)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->readNames)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->readNames)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  this->readNameMap = rnm;
  (this->consistingReads).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->consistingReads).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->consistingReads).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->reference_seq1)._M_dataplus._M_p = (pointer)&(this->reference_seq1).field_2;
  (this->reference_seq1)._M_string_length = 0;
  (this->reference_seq1).field_2._M_local_buf[0] = '\0';
  (this->reference_seq2)._M_dataplus._M_p = (pointer)&(this->reference_seq2).field_2;
  (this->reference_seq2)._M_string_length = 0;
  (this->reference_seq2).field_2._M_local_buf[0] = '\0';
  (this->alignSequence1)._M_dataplus._M_p = (pointer)&(this->alignSequence1).field_2;
  (this->alignSequence1)._M_string_length = 0;
  (this->alignSequence1).field_2._M_local_buf[0] = '\0';
  (this->alignSequence2)._M_dataplus._M_p = (pointer)&(this->alignSequence2).field_2;
  (this->alignSequence2)._M_string_length = 0;
  (this->alignSequence2).field_2._M_local_buf[0] = '\0';
  (this->code1)._M_dataplus._M_p = (pointer)&(this->code1).field_2;
  (this->code1)._M_string_length = 0;
  local_178 = &this->cov_pos;
  (this->code1).field_2._M_local_buf[0] = '\0';
  (this->code2)._M_dataplus._M_p = (pointer)&(this->code2).field_2;
  (this->code2)._M_string_length = 0;
  local_140 = &this->readNames;
  local_160 = (string *)&this->reference_seq1;
  (this->code2).field_2._M_local_buf[0] = '\0';
  (this->gcQuality1)._M_dataplus._M_p = (pointer)&(this->gcQuality1).field_2;
  (this->gcQuality1)._M_string_length = 0;
  local_168 = (string *)&this->alignSequence1;
  (this->gcQuality1).field_2._M_local_buf[0] = '\0';
  (this->gcQuality2)._M_dataplus._M_p = (pointer)&(this->gcQuality2).field_2;
  (this->gcQuality2)._M_string_length = 0;
  (this->gcQuality2).field_2._M_local_buf[0] = '\0';
  local_170 = &this->qualityList1;
  (this->qualityList2).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)0x0;
  (this->qualityList2).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)0x0;
  (this->qualityList1).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)0x0;
  (this->qualityList2).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)0x0;
  (this->qualityList1).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)0x0;
  (this->qualityList1).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)0x0;
  this->support = 0;
  this->uniqueSupport = 0;
  this->single_end = true;
  std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
  _M_insert_unique<int_const&>
            ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)local_140,
             &readRef_local);
  std::__cxx11::string::_M_assign((string *)this);
  this->start1 = *(int *)(alignment + 0xac) + 1;
  uVar6 = BamTools::BamAlignment::GetEndPosition(SUB81(alignment,0),false);
  this->end1 = uVar6;
  std::vector<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_>::operator=
            (&this->cigar1,
             (vector<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_> *)(alignment + 0xb8));
  this->support = 0;
  this->uniqueSupport = 0;
  phred = (AlignmentRecord *)(alignment + 0x68);
  iVar7 = phred_sum((string *)phred,'!');
  this->phred_sum1 = iVar7;
  pCVar3 = (this->cigar1).super__Vector_base<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  for (__x = (this->cigar1).
             super__Vector_base<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_>._M_impl.
             super__Vector_impl_data._M_start; this_00 = local_158, __x != pCVar3; __x = __x + 1) {
    for (uVar6 = 0; uVar2 = __x->Length, uVar6 < uVar2; uVar6 = uVar6 + 1) {
      std::vector<char,_std::allocator<char>_>::push_back(&this->cigar1_unrolled,&__x->Type);
    }
    if ((__x->Type == 'D') &&
       (this->length_incl_deletions1 = this->length_incl_deletions1 + uVar2, 1 < uVar2)) {
      this->length_incl_longdeletions1 = this->length_incl_longdeletions1 + uVar2;
    }
  }
  cVar4 = BamTools::BamAlignment::IsPaired();
  if (cVar4 == '\0') {
    bVar5 = BamTools::BamAlignment::IsReverseStrand();
    this->strand1 = (bool)(bVar5 ^ 1);
    goto LAB_00184e47;
  }
  cVar4 = BamTools::BamAlignment::IsFirstMate();
  if (cVar4 == '\0') {
    cVar4 = BamTools::BamAlignment::IsSecondMate();
    if (cVar4 == '\0') goto LAB_00184e47;
    cVar4 = BamTools::BamAlignment::IsReverseStrand();
    if (cVar4 != '\0') goto LAB_00184e40;
  }
  else {
    cVar4 = BamTools::BamAlignment::IsReverseStrand();
    if (cVar4 == '\0') {
LAB_00184e40:
      this->strand1 = true;
      goto LAB_00184e47;
    }
  }
  this->strand1 = false;
LAB_00184e47:
  this->refId = *(int *)(alignment + 0xa8);
  std::__cxx11::string::string((string *)&querySequence,(string *)(alignment + 0x28));
  std::vector<char,_std::allocator<char>_>::vector
            ((vector<char,_std::allocator<char>_> *)&local_128,&this->cigar1_unrolled);
  iVar7 = *(int *)(alignment + 0xac);
  this_01 = phred;
  std::__cxx11::string::string((string *)&local_f0,(string *)phred);
  referenceString(&ref1,this_01,(vector<char,_std::allocator<char>_> *)&local_128,iVar7,
                  &querySequence,&local_f0,mainReference);
  std::__cxx11::string::~string((string *)&local_f0);
  std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base(&local_128);
  ShortDnaSequence::ShortDnaSequence(&local_78,&querySequence,(string *)phred);
  ShortDnaSequence::operator=(this_00,&local_78);
  ShortDnaSequence::~ShortDnaSequence(&local_78);
  std::__cxx11::string::_M_assign(local_160);
  std::__cxx11::string::_M_assign(local_168);
  std::vector<int,_std::allocator<int>_>::operator=
            (local_170,(vector<int,_std::allocator<int>_> *)&ref1);
  sVar8 = ShortDnaSequence::size(this_00);
  this->length_incl_deletions1 = (int)sVar8;
  sVar8 = ShortDnaSequence::size(this_00);
  this->length_incl_longdeletions1 = (int)sVar8;
  coveredPositions((vector<AlignmentRecord::mapValue,_std::allocator<AlignmentRecord::mapValue>_> *)
                   &local_78,this);
  std::vector<AlignmentRecord::mapValue,_std::allocator<AlignmentRecord::mapValue>_>::_M_move_assign
            (local_178,&local_78);
  std::_Vector_base<AlignmentRecord::mapValue,_std::allocator<AlignmentRecord::mapValue>_>::
  ~_Vector_base((_Vector_base<AlignmentRecord::mapValue,_std::allocator<AlignmentRecord::mapValue>_>
                 *)&local_78);
  std::
  _Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>
  ::~_Tuple_impl(&ref1.
                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>
                );
  std::__cxx11::string::~string((string *)&querySequence);
  return;
}

Assistant:

AlignmentRecord::AlignmentRecord(const BamTools::BamAlignment& alignment, int readRef, vector<string>* rnm , string &mainReference) : readNameMap(rnm) {

    this->single_end = true;
    this->readNames.insert(readRef);
    this->name = alignment.Name;
    this->start1 = alignment.Position + 1;
    this->end1 = alignment.GetEndPosition();
    this->cigar1 = alignment.CigarData;
    this->uniqueSupport = 0;
    this->support = 0;

    this->phred_sum1 = phred_sum(alignment.Qualities);
    //Constructing the unrolled cigar strings
    for (const auto& it : cigar1) {
        for (unsigned int s = 0; s < it.Length; ++s) {
            this->cigar1_unrolled.push_back(it.Type);
        }
        if (it.Type == 'D') {
            this->length_incl_deletions1+=it.Length;
            if (it.Length > 1) {
                this->length_incl_longdeletions1+=it.Length;
            }
        }
    }

    //NoMe Additions
    //Determines if the alignment is forward or reverse stranded
    if(!alignment.IsPaired()){
    this->strand1 = !alignment.IsReverseStrand();
    }else{
        if(alignment.IsFirstMate()){
            if(!alignment.IsReverseStrand()){
                this->strand1=true;
            }else{
                this->strand1=false;
            }
        }else if(alignment.IsSecondMate()){
            if(alignment.IsReverseStrand()){
                this->strand1=true;
            }else{
                this->strand1=false;
            }
        }
    }
    this->refId=alignment.RefID;
    string querySequence = alignment.QueryBases;
    //Reference string returns the reference, the aligned sequence and the quality list
    auto ref1 = referenceString(this->getCigar1Unrolled(),alignment.Position,querySequence,alignment.Qualities,mainReference);
    this->sequence1 = ShortDnaSequence(querySequence, alignment.Qualities);

    this->reference_seq1 = std::get<0>(ref1);
    this->alignSequence1=std::get<1>(ref1);
    this->qualityList1 = std::get<2>(ref1);
    this->length_incl_deletions1 = this->sequence1.size();
    this->length_incl_longdeletions1 = this->sequence1.size();

    //End Nome additions



    this->cov_pos = this->coveredPositions();
}